

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

int json_cfg_encode_keep_buffer(lua_State *l)

{
  int iVar1;
  json_config_t *pjVar2;
  int old_value;
  json_config_t *cfg;
  lua_State *l_local;
  
  pjVar2 = json_arg_init(l,1);
  iVar1 = pjVar2->encode_keep_buffer;
  json_enum_option(l,1,&pjVar2->encode_keep_buffer,(char **)0x0,1);
  if (iVar1 != pjVar2->encode_keep_buffer) {
    if (pjVar2->encode_keep_buffer == 0) {
      strbuf_free(&pjVar2->encode_buf);
    }
    else {
      strbuf_init(&pjVar2->encode_buf,0);
    }
  }
  return 1;
}

Assistant:

static int json_cfg_encode_keep_buffer(lua_State *l)
{
    json_config_t *cfg = json_arg_init(l, 1);
    int old_value;

    old_value = cfg->encode_keep_buffer;

    json_enum_option(l, 1, &cfg->encode_keep_buffer, NULL, 1);

    /* Init / free the buffer if the setting has changed */
    if (old_value ^ cfg->encode_keep_buffer) {
        if (cfg->encode_keep_buffer)
            strbuf_init(&cfg->encode_buf, 0);
        else
            strbuf_free(&cfg->encode_buf);
    }

    return 1;
}